

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix_test.cc
# Opt level: O3

void anon_unknown.dwarf_f599::CheckCloseOnExecDoesNotLeakFDs
               (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                *baseline_open_fds)

{
  __node_base *p_Var1;
  pointer pcVar2;
  size_t sVar3;
  size_type sVar4;
  _Hash_node_base *p_Var5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *this;
  undefined8 *puVar10;
  ulong uVar11;
  pointer pcVar12;
  char *pcVar13;
  _Hash_node_base *in_R9;
  string *unaff_R13;
  _Hash_node_base *p_Var14;
  ulong uVar15;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *message;
  long lVar16;
  bool bVar17;
  int fd;
  char *child_argv [4];
  int child_status;
  int child_pid;
  vector<char,_std::allocator<char>_> fd_buffer;
  string fd_string;
  char switch_buffer [28];
  Slice SStack_220;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_210;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_208;
  pointer pcStack_200;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_1f8;
  string sStack_1f0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_1d0;
  undefined8 *puStack_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined1 *puStack_1b0;
  long lStack_1a8;
  undefined1 auStack_1a0 [16];
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  _Stack_190;
  pointer pcStack_158;
  __node_base *p_Stack_150;
  string *psStack_148;
  ulong uStack_140;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Stack_138;
  code *pcStack_130;
  Message local_120;
  undefined8 *local_118;
  AssertHelper local_110;
  pointer local_108;
  char *local_100;
  pointer local_f8;
  undefined8 local_f0;
  string local_e0;
  uint local_c0;
  __pid_t local_bc;
  vector<char,_std::allocator<char>_> local_b8;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_98;
  AssertHelper local_60;
  char local_58 [40];
  
  builtin_strncpy(local_58 + 0x10,"exec-helper",0xc);
  builtin_strncpy(local_58,"--test-close-on-",0x10);
  local_98._M_buckets = &local_98._M_single_bucket;
  local_98._M_bucket_count = 1;
  local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_98._M_element_count = 0;
  local_98._M_rehash_policy._M_max_load_factor = 1.0;
  local_98._M_rehash_policy._M_next_resize = 0;
  local_98._M_single_bucket = (__node_base_ptr)0x0;
  pcStack_130 = (code *)0x10acdb;
  GetOpenFileDescriptors
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &local_98);
  p_Var14 = (baseline_open_fds->_M_h)._M_before_begin._M_nxt;
  if (p_Var14 != (_Hash_node_base *)0x0) {
    unaff_R13 = &local_e0;
    do {
      local_120.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = *(int *)&p_Var14[1]._M_nxt;
      local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,1);
      p_Var5 = (_Hash_node_base *)0x0;
      if ((local_98._M_buckets
           [(ulong)(long)(int)local_120.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl % local_98._M_bucket_count] != (__node_base_ptr)0x0) &&
         (in_R9 = local_98._M_buckets
                  [(ulong)(long)(int)local_120.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl % local_98._M_bucket_count]->_M_nxt,
         p_Var5 = in_R9,
         (int)local_120.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl != *(int *)&in_R9[1]._M_nxt)) {
        while (in_R9 = in_R9->_M_nxt, in_R9 != (_Hash_node_base *)0x0) {
          p_Var5 = (_Hash_node_base *)0x0;
          if (((ulong)(long)*(int *)&in_R9[1]._M_nxt % local_98._M_bucket_count !=
               (ulong)(long)(int)local_120.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl % local_98._M_bucket_count) ||
             (p_Var5 = in_R9,
             (int)local_120.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl == *(int *)&in_R9[1]._M_nxt)) goto LAB_0010ad6a;
        }
        p_Var5 = (_Hash_node_base *)0x0;
      }
LAB_0010ad6a:
      local_e0._M_dataplus._M_p = (pointer)(ulong)(p_Var5 != (_Hash_node_base *)0x0);
      pcStack_130 = (code *)0x10ad93;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)&local_108,"1","open_fds.count(fd)",(int *)&local_b8,
                 (unsigned_long *)unaff_R13);
      pcVar13 = local_100;
      if (local_108._0_1_ == (internal)0x0) {
        pcStack_130 = (code *)0x10ae8d;
        testing::Message::Message((Message *)&local_e0);
        pcStack_130 = (code *)0x10aea5;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_e0._M_dataplus._M_p + 0x10),
                   "Previously opened file descriptor was closed during test setup",0x3e);
        if (local_100 == (char *)0x0) {
          pcVar13 = "";
        }
        else {
          pcVar13 = *(char **)local_100;
        }
        iVar6 = 0x76;
        goto LAB_0010aef6;
      }
      if (local_100 != (char *)0x0) {
        if (*(undefined8 **)local_100 != (undefined8 *)((long)local_100 + 0x10)) {
          pcStack_130 = (code *)0x10adba;
          operator_delete(*(undefined8 **)local_100);
        }
        pcStack_130 = (code *)0x10adc2;
        operator_delete(pcVar13);
      }
      pcStack_130 = (code *)0x10add2;
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(&local_98,&local_120);
      p_Var14 = p_Var14->_M_nxt;
    } while (p_Var14 != (_Hash_node_base *)0x0);
  }
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT44(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,1);
  local_e0._M_dataplus._M_p = (pointer)local_98._M_element_count;
  pcStack_130 = (code *)0x10ae14;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_108,"1","open_fds.size()",(int *)&local_b8,
             (unsigned_long *)&local_e0);
  if (local_108._0_1_ == (internal)0x0) {
    pcStack_130 = (code *)0x10ae59;
    testing::Message::Message((Message *)&local_e0);
    pcStack_130 = (code *)0x10ae71;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_e0._M_dataplus._M_p + 0x10),
               "Expected exactly one newly opened file descriptor during test setup",0x43);
    if (local_100 == (char *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_100;
    }
    iVar6 = 0x7a;
LAB_0010aef6:
    pcStack_130 = (code *)0x10aefb;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
               ,iVar6,pcVar13);
    pcStack_130 = (code *)0x10af0b;
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_e0);
    pcStack_130 = (code *)0x10af13;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_e0._M_dataplus._M_p != (long *)0x0) {
      pcStack_130 = (code *)0x10af21;
      (**(code **)(*(long *)local_e0._M_dataplus._M_p + 8))();
    }
    pcVar13 = local_100;
    if (local_100 != (char *)0x0) {
      if (*(undefined8 **)local_100 != (undefined8 *)((long)local_100 + 0x10)) {
        pcStack_130 = (code *)0x10af3c;
        operator_delete(*(undefined8 **)local_100);
      }
      pcStack_130 = (code *)0x10af44;
      operator_delete(local_100);
    }
  }
  else {
    if (local_100 != (char *)0x0) {
      if (*(undefined8 **)local_100 != (undefined8 *)((long)local_100 + 0x10)) {
        pcStack_130 = (code *)0x10ae34;
        operator_delete(*(undefined8 **)local_100);
      }
      pcStack_130 = (code *)0x10ae3c;
      operator_delete(local_100);
    }
    pcVar13 = (char *)(ulong)*(uint *)&local_98._M_before_begin._M_nxt[1]._M_nxt;
  }
  pcStack_130 = (code *)0x10af51;
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_98);
  uVar9 = (uint)pcVar13;
  uVar11 = (ulong)-uVar9;
  if (0 < (int)uVar9) {
    uVar11 = (ulong)pcVar13 & 0xffffffff;
  }
  uVar15 = 1;
  if (9 < (uint)uVar11) {
    uVar15 = 4;
    uVar8 = uVar11;
    do {
      uVar7 = (uint)uVar8;
      iVar6 = (int)uVar15;
      if (uVar7 < 100) {
        uVar15 = (ulong)(iVar6 - 2);
        goto LAB_0010afac;
      }
      if (uVar7 < 1000) {
        uVar15 = (ulong)(iVar6 - 1);
        goto LAB_0010afac;
      }
      if (uVar7 < 10000) goto LAB_0010afac;
      uVar8 = uVar8 / 10000;
      uVar15 = (ulong)(iVar6 + 4);
    } while (99999 < uVar7);
    uVar15 = (ulong)(iVar6 + 1);
  }
LAB_0010afac:
  p_Var1 = &local_98._M_before_begin;
  pcStack_130 = (code *)0x10afd5;
  local_98._M_buckets = &p_Var1->_M_nxt;
  std::__cxx11::string::_M_construct
            ((ulong)&local_98,(char)uVar15 - ((char)((ulong)pcVar13 >> 0x18) >> 7));
  pcStack_130 = (code *)0x10afe5;
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_98._M_buckets + (ulong)(uVar9 >> 0x1f)),(uint)uVar15,(uint)uVar11)
  ;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (char *)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (char *)0x0;
  pcStack_130 = (code *)0x10b00a;
  std::vector<char,std::allocator<char>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<char,std::allocator<char>> *)&local_b8,local_98._M_buckets,
             (undefined1 *)((long)local_98._M_buckets + local_98._M_bucket_count));
  local_108 = (pointer)((ulong)local_108 & 0xffffffffffffff00);
  if (local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    pcStack_130 = (code *)0x10b032;
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              (&local_b8,
               (iterator)
               local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,(char *)&local_108);
  }
  else {
    *local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
     _M_finish = '\0';
    local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  pcStack_130 = (code *)0x10b037;
  GetArgvZero();
  pcVar2 = GetArgvZero::program_name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_108 = GetArgvZero::program_name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_100 = local_58;
  local_f8 = local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_f0 = 0;
  pcStack_130 = (code *)0x10b068;
  local_bc = fork();
  if (local_bc != 0) {
    local_c0 = 0;
    pcStack_130 = (code *)0x10b088;
    local_120.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = waitpid(local_bc,(int *)&local_c0,0);
    pcStack_130 = (code *)0x10b0b0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_e0,"child_pid","::waitpid(child_pid, &child_status, 0)",&local_bc,
               (int *)&local_120);
    sVar4 = local_e0._M_string_length;
    if ((char)local_e0._M_dataplus._M_p == '\0') {
      pcStack_130 = (code *)0x10b1af;
      testing::Message::Message(&local_120);
      if ((undefined8 *)local_e0._M_string_length == (undefined8 *)0x0) {
        pcVar13 = "";
      }
      else {
        pcVar13 = *(char **)local_e0._M_string_length;
      }
      iVar6 = 0x9c;
    }
    else {
      if ((undefined8 *)local_e0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_e0._M_string_length !=
            (undefined8 *)(local_e0._M_string_length + 0x10)) {
          pcStack_130 = (code *)0x10b0d4;
          operator_delete(*(undefined8 **)local_e0._M_string_length);
        }
        pcStack_130 = (code *)0x10b0dc;
        operator_delete((void *)sVar4);
      }
      bVar17 = (local_c0 & 0x7f) == 0;
      local_120.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_120.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,bVar17);
      local_118 = (undefined8 *)0x0;
      if (!bVar17) {
        pcStack_130 = (code *)0x10b103;
        testing::Message::Message((Message *)&local_110);
        pcStack_130 = (code *)0x10b11b;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_110.data_._4_4_,(uint)local_110.data_) + 0x10),
                   "The helper process did not exit with an exit code",0x31);
        pcStack_130 = (code *)0x10b142;
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_e0,(internal *)&local_120,(AssertionResult *)"WIFEXITED(child_status)",
                   "false","true",(char *)in_R9);
        pcStack_130 = (code *)0x10b166;
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
                   ,0x9d,local_e0._M_dataplus._M_p);
        pcStack_130 = (code *)0x10b171;
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_110);
        pcStack_130 = (code *)0x10b179;
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          pcStack_130 = (code *)0x10b18b;
          operator_delete(local_e0._M_dataplus._M_p);
        }
        puVar10 = local_118;
        if ((long *)CONCAT44(local_110.data_._4_4_,(uint)local_110.data_) != (long *)0x0) {
          pcStack_130 = (code *)0x10b19b;
          (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,(uint)local_110.data_) + 8))();
          puVar10 = local_118;
        }
        goto LAB_0010b283;
      }
      local_120.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      local_110.data_._0_4_ = local_c0 >> 8 & 0xff;
      pcStack_130 = (code *)0x10b1ef;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_e0,"0","(((child_status) & 0xff00) >> 8)",(int *)&local_120,
                 (int *)&local_110);
      puVar10 = (undefined8 *)local_e0._M_string_length;
      if ((char)local_e0._M_dataplus._M_p != '\0') goto LAB_0010b283;
      pcStack_130 = (code *)0x10b205;
      testing::Message::Message(&local_120);
      pcStack_130 = (code *)0x10b21d;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT44(local_120.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_120.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) + 0x10),"The helper process encountered an error",
                 0x27);
      if ((undefined8 *)local_e0._M_string_length == (undefined8 *)0x0) {
        pcVar13 = "";
      }
      else {
        pcVar13 = *(char **)local_e0._M_string_length;
      }
      iVar6 = 0x9f;
    }
    pcStack_130 = (code *)0x10b258;
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
               ,iVar6,pcVar13);
    pcStack_130 = (code *)0x10b268;
    testing::internal::AssertHelper::operator=(&local_110,&local_120);
    pcStack_130 = (code *)0x10b270;
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    puVar10 = (undefined8 *)local_e0._M_string_length;
    if ((long *)CONCAT44(local_120.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_120.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      pcStack_130 = (code *)0x10b27e;
      (**(code **)(*(long *)CONCAT44(local_120.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_120.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
      puVar10 = (undefined8 *)local_e0._M_string_length;
    }
LAB_0010b283:
    if (puVar10 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar10 != puVar10 + 2) {
        pcStack_130 = (code *)0x10b299;
        operator_delete((undefined8 *)*puVar10);
      }
      pcStack_130 = (code *)0x10b2a1;
      operator_delete(puVar10);
    }
    if (local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      pcStack_130 = (code *)0x10b2b0;
      operator_delete(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((__node_base *)local_98._M_buckets != p_Var1) {
      pcStack_130 = (code *)0x10b2c2;
      operator_delete(local_98._M_buckets);
    }
    return;
  }
  pcStack_130 = leveldb::EnvPosixTest_TestCloseOnExecRandomAccessFile_Test::TestBody;
  pcVar12 = pcVar2;
  _GLOBAL__N_1::CheckCloseOnExecDoesNotLeakFDs();
  pcStack_158 = pcVar2;
  _Stack_190._M_buckets = &_Stack_190._M_single_bucket;
  _Stack_190._M_bucket_count = 1;
  _Stack_190._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  _Stack_190._M_element_count = 0;
  _Stack_190._M_rehash_policy._M_max_load_factor = 1.0;
  _Stack_190._M_rehash_policy._M_next_resize = 0;
  _Stack_190._M_single_bucket = (__node_base_ptr)0x0;
  p_Stack_150 = p_Var1;
  psStack_148 = unaff_R13;
  uStack_140 = uVar15;
  p_Stack_138 = &local_98;
  pcStack_130 = (code *)uVar11;
  GetOpenFileDescriptors
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &_Stack_190);
  puStack_1b0 = auStack_1a0;
  lStack_1a8 = 0;
  auStack_1a0[0] = 0;
  pcStack_200 = pcVar12;
  (**(code **)(**(long **)(pcVar12 + 0x10) + 0x98))
            (&_Stack_1d0,*(long **)(pcVar12 + 0x10),&puStack_1b0);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&sStack_1f0,
             (char *)&SStack_220,(Status *)"env_->GetTestDirectory(&test_dir)");
  if (_Stack_1d0._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(_Stack_1d0._M_head_impl);
  }
  if ((char)sStack_1f0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&_Stack_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_1f0._M_string_length ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)sStack_1f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&SStack_220,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
               ,0xef,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&SStack_220,(Message *)&_Stack_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&SStack_220);
    if (_Stack_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Stack_1d0._M_head_impl + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_1f0._M_string_length ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0010b851;
    if (*(char **)sStack_1f0._M_string_length != (char *)(sStack_1f0._M_string_length + 0x10)) {
      operator_delete(*(char **)sStack_1f0._M_string_length);
    }
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_1f0._M_string_length !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (*(char **)sStack_1f0._M_string_length != (char *)(sStack_1f0._M_string_length + 0x10)) {
        operator_delete(*(char **)sStack_1f0._M_string_length);
      }
      operator_delete((void *)sStack_1f0._M_string_length);
    }
    sStack_1f0._M_dataplus._M_p = (pointer)&sStack_1f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_1f0,puStack_1b0,puStack_1b0 + lStack_1a8);
    std::__cxx11::string::append((char *)&sStack_1f0);
    SStack_220.data_ = "0123456789";
    SStack_220.size_ = (size_t)&DAT_0000000a;
    leveldb::WriteStringToFile
              ((leveldb *)&_Stack_208,*(Env **)(pcStack_200 + 0x10),&SStack_220,&sStack_1f0);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&_Stack_1d0,
               (char *)&_Stack_210,(Status *)"WriteStringToFile(env_, \"0123456789\", file_path)");
    if (_Stack_208._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete__(_Stack_208._M_head_impl);
    }
    if (_Stack_1d0._M_head_impl._0_1_ ==
        (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&SStack_220);
      if (puStack_1c8 == (undefined8 *)0x0) {
        pcVar13 = "";
      }
      else {
        pcVar13 = (char *)*puStack_1c8;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&_Stack_208,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
                 ,0xf1,pcVar13);
      testing::internal::AssertHelper::operator=((AssertHelper *)&_Stack_208,(Message *)&SStack_220)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&_Stack_208);
      puVar10 = puStack_1c8;
      if ((long *)SStack_220.data_ != (long *)0x0) {
        (**(code **)(*(long *)SStack_220.data_ + 8))();
        puVar10 = puStack_1c8;
      }
    }
    else {
      if (puStack_1c8 != (undefined8 *)0x0) {
        if ((undefined8 *)*puStack_1c8 != puStack_1c8 + 2) {
          operator_delete((undefined8 *)*puStack_1c8);
        }
        operator_delete(puStack_1c8);
      }
      uStack_1c0 = 0;
      uStack_1b8 = 0;
      _Stack_1d0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      puStack_1c8 = (undefined8 *)0x0;
      lVar16 = 0;
      do {
        (**(code **)(**(long **)(pcStack_200 + 0x10) + 0x18))
                  (&_Stack_208,*(long **)(pcStack_200 + 0x10),&sStack_1f0,
                   (long)&_Stack_1d0._M_head_impl + lVar16);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&SStack_220,
                   (char *)&_Stack_210,
                   (Status *)"env_->NewRandomAccessFile(file_path, &mmapped_files[i])");
        if (_Stack_208._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(_Stack_208._M_head_impl);
        }
        sVar3 = SStack_220.size_;
        if ((char)SStack_220.data_ == '\0') {
          testing::Message::Message((Message *)&_Stack_208);
          if ((undefined8 *)SStack_220.size_ == (undefined8 *)0x0) {
            pcVar13 = "";
          }
          else {
            pcVar13 = *(char **)SStack_220.size_;
          }
          this = &_Stack_210;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
                     ,0xf8,pcVar13);
          message = &_Stack_208;
          goto LAB_0010b7fe;
        }
        if ((undefined8 *)SStack_220.size_ != (undefined8 *)0x0) {
          if (*(undefined8 **)SStack_220.size_ != (undefined8 *)(SStack_220.size_ + 0x10)) {
            operator_delete(*(undefined8 **)SStack_220.size_);
          }
          operator_delete((void *)sVar3);
        }
        lVar16 = lVar16 + 8;
      } while (lVar16 != 0x20);
      _Stack_208._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      (**(code **)(**(long **)(pcStack_200 + 0x10) + 0x18))
                (&_Stack_210,*(long **)(pcStack_200 + 0x10),&sStack_1f0);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&SStack_220,
                 (char *)&_Stack_1f8,(Status *)"env_->NewRandomAccessFile(file_path, &file)");
      if (_Stack_210._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete__(_Stack_210._M_head_impl);
      }
      sVar3 = SStack_220.size_;
      if ((char)SStack_220.data_ == '\0') {
        testing::Message::Message((Message *)&_Stack_210);
        if ((undefined8 *)SStack_220.size_ == (undefined8 *)0x0) {
          pcVar13 = "";
        }
        else {
          pcVar13 = *(char **)SStack_220.size_;
        }
        iVar6 = 0xfc;
      }
      else {
        if ((undefined8 *)SStack_220.size_ != (undefined8 *)0x0) {
          if (*(undefined8 **)SStack_220.size_ != (undefined8 *)(SStack_220.size_ + 0x10)) {
            operator_delete(*(undefined8 **)SStack_220.size_);
          }
          operator_delete((void *)sVar3);
        }
        CheckCloseOnExecDoesNotLeakFDs
                  ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   &_Stack_190);
        if (_Stack_208._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)_Stack_208._M_head_impl + 8))();
        }
        lVar16 = 0;
        do {
          if ((&_Stack_1d0)[lVar16]._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)(&_Stack_1d0)[lVar16]._M_head_impl + 8))();
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        (**(code **)(**(long **)(pcStack_200 + 0x10) + 0x40))
                  (&_Stack_210,*(long **)(pcStack_200 + 0x10),&sStack_1f0);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&SStack_220,
                   (char *)&_Stack_1f8,(Status *)"env_->RemoveFile(file_path)");
        if (_Stack_210._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(_Stack_210._M_head_impl);
        }
        puVar10 = (undefined8 *)SStack_220.size_;
        if ((char)SStack_220.data_ != '\0') goto LAB_0010b824;
        testing::Message::Message((Message *)&_Stack_210);
        if ((undefined8 *)SStack_220.size_ == (undefined8 *)0x0) {
          pcVar13 = "";
        }
        else {
          pcVar13 = *(char **)SStack_220.size_;
        }
        iVar6 = 0x103;
      }
      this = &_Stack_1f8;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&_Stack_1f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
                 ,iVar6,pcVar13);
      message = &_Stack_210;
LAB_0010b7fe:
      testing::internal::AssertHelper::operator=((AssertHelper *)this,(Message *)message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this);
      puVar10 = (undefined8 *)SStack_220.size_;
      if (message->_M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)message->_M_head_impl + 8))();
        puVar10 = (undefined8 *)SStack_220.size_;
      }
    }
LAB_0010b824:
    if (puVar10 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar10 != puVar10 + 2) {
        operator_delete((undefined8 *)*puVar10);
      }
      operator_delete(puVar10);
    }
    sStack_1f0._M_string_length = (size_type)sStack_1f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_1f0._M_dataplus._M_p == &sStack_1f0.field_2) goto LAB_0010b851;
  }
  operator_delete((void *)sStack_1f0._M_string_length);
LAB_0010b851:
  if (puStack_1b0 != auStack_1a0) {
    operator_delete(puStack_1b0);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&_Stack_190);
  return;
}

Assistant:

void CheckCloseOnExecDoesNotLeakFDs(
    const std::unordered_set<int>& baseline_open_fds) {
  // Prepare the argument list for the child process.
  // execv() wants mutable buffers.
  char switch_buffer[sizeof(kTestCloseOnExecSwitch)];
  std::memcpy(switch_buffer, kTestCloseOnExecSwitch,
              sizeof(kTestCloseOnExecSwitch));

  int probed_fd;
  GetNewlyOpenedFileDescriptor(baseline_open_fds, &probed_fd);
  std::string fd_string = std::to_string(probed_fd);
  std::vector<char> fd_buffer(fd_string.begin(), fd_string.end());
  fd_buffer.emplace_back('\0');

  // The helper process is launched with the command below.
  //      env_posix_tests --test-close-on-exec-helper 3
  char* child_argv[] = {GetArgvZero()->data(), switch_buffer, fd_buffer.data(),
                        nullptr};

  constexpr int kForkInChildProcessReturnValue = 0;
  int child_pid = fork();
  if (child_pid == kForkInChildProcessReturnValue) {
    ::execv(child_argv[0], child_argv);
    std::fprintf(stderr, "Error spawning child process: %s\n", strerror(errno));
    std::exit(kTextCloseOnExecHelperExecFailedCode);
  }

  int child_status = 0;
  ASSERT_EQ(child_pid, ::waitpid(child_pid, &child_status, 0));
  ASSERT_TRUE(WIFEXITED(child_status))
      << "The helper process did not exit with an exit code";
  ASSERT_EQ(0, WEXITSTATUS(child_status))
      << "The helper process encountered an error";
}